

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O3

void __thiscall Cholesky_solve_Test::TestBody(Cholesky_solve_Test *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  bool bVar9;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pCVar10;
  CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_> *pCVar11;
  CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_> *this_00;
  char *pcVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 local_188 [8];
  Matrix<T,_4,_3> P;
  undefined1 auStack_150 [4];
  Matrix<T,_3,_3> S_;
  Scalar local_128;
  Scalar local_124;
  long local_120;
  undefined1 auStack_118 [8];
  Matrix<T,_4,_3> P_;
  undefined8 uStack_d8;
  AssertionResult gtest_ar;
  Scalar local_b0;
  undefined8 local_ac;
  undefined4 local_a4;
  float local_a0;
  float fStack_9c;
  undefined8 local_98;
  float local_90;
  char local_88;
  float *local_80;
  Scalar local_78;
  Scalar local_74;
  Scalar local_70;
  Scalar local_6c;
  undefined8 local_68;
  float fStack_60;
  undefined4 uStack_5c;
  float local_58;
  float fStack_54;
  undefined8 uStack_50;
  float local_48;
  AssertHelper local_38;
  
  auStack_118 = (undefined1  [8])
                (P.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.
                 array + 0xb);
  P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[0] = 0.0;
  P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[1] = 0.0;
  P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[2] =
       1.4013e-45;
  P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[3] = 0.0;
  P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[4] =
       1.4013e-45;
  P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[5] = 0.0;
  P.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[0xb] = 1.0;
  local_b0 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                      ((CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)auStack_118,
                       &local_b0);
  uStack_d8._0_4_ = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                      (pCVar10,(Scalar *)&uStack_d8);
  local_68._0_4_ = 1.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                      (pCVar10,(Scalar *)&local_68);
  local_38.data_._0_4_ = 0x3f800000;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                      (pCVar10,(Scalar *)&local_38);
  local_78 = 0.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                      (pCVar10,&local_78);
  local_74 = 1.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                      (pCVar10,&local_74);
  local_70 = 1.0;
  pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                      (pCVar10,&local_70);
  local_6c = 2.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar10,&local_6c);
  if ((P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array._16_8_
       + P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array._0_8_
       == 3) &&
     (P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array._8_8_ ==
      3)) {
    local_b0 = P.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array
               [0xb];
    local_ac = _auStack_150;
    local_a4 = 0;
    local_a0 = S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [2];
    fStack_9c = S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array[3];
    local_98 = 0;
    local_90 = S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [6];
    local_88 = '\x01';
    auStack_118 = (undefined1  [8])local_188;
    this_00 = (CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_> *)auStack_118;
    P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[0] = 0.0;
    P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[1] = 0.0;
    P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[2] =
         1.4013e-45;
    P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[3] = 0.0;
    P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[4] =
         1.4013e-45;
    P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[5] = 0.0;
    local_188._0_4_ = 6.0;
    uStack_d8._0_4_ = 4.0;
    local_80 = (float *)auStack_118;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                        (this_00,(Scalar *)&uStack_d8);
    local_68._0_4_ = 2.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                        (pCVar11,(Scalar *)&local_68);
    local_38.data_._0_4_ = 0x40800000;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                        (pCVar11,(Scalar *)&local_38);
    local_78 = 8.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                        (pCVar11,&local_78);
    local_74 = 6.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                        (pCVar11,&local_74);
    local_70 = 2.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                        (pCVar11,&local_70);
    local_6c = 6.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                        (pCVar11,&local_6c);
    S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                        (pCVar11,S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array + 7);
    S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 3.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                        (pCVar11,S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array + 8);
    local_128 = 5.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                        (pCVar11,&local_128);
    local_124 = 7.0;
    Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_(pCVar11,&local_124);
    if ((P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array.
         _16_8_ + P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.
                  array._0_8_ == 4) &&
       (P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array._8_8_
        == 3)) {
      uStack_d8 = (non_const_type)local_188;
      if (local_88 == '\0') {
        __assert_fail("derived().m_isInitialized && \"Solver is not initialized.\"",
                      "/usr/include/eigen3/Eigen/src/Core/SolverBase.h",0x96,
                      "void Eigen::SolverBase<Eigen::LLT<Eigen::Matrix<float, 3, 3>>>::_check_solve_assertion(const Rhs &) const [Derived = Eigen::LLT<Eigen::Matrix<float, 3, 3>>, Transpose_ = false, Rhs = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<float, 4, 3>>>]"
                     );
      }
      auStack_118 = (undefined1  [8])
                    (P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data
                     .array + 2);
      Eigen::LLT<Eigen::Matrix<float,3,3,0,3,3>,1>::
      _solve_impl_transposed<true,Eigen::Transpose<Eigen::Matrix<float,4,3,0,4,3>>,Eigen::Matrix<float,3,4,1,3,4>>
                ((LLT<Eigen::Matrix<float,3,3,0,3,3>,1> *)&local_b0,
                 (Transpose<Eigen::Matrix<float,_4,_3,_0,_4,_3>_> *)&uStack_d8,
                 (Matrix<float,_3,_4,_1,_3,_4> *)auStack_118);
      if (local_88 != '\0') {
        fVar18 = *(float *)auStack_118;
        fVar19 = *(float *)((long)auStack_118 + 4);
        fVar20 = *(float *)((long)auStack_118 + 8);
        fVar21 = *(float *)((long)auStack_118 + 0xc);
        fVar1 = *(float *)((long)auStack_118 + 0x10);
        fVar2 = *(float *)((long)auStack_118 + 0x14);
        fVar3 = *(float *)((long)auStack_118 + 0x18);
        fVar4 = *(float *)((long)auStack_118 + 0x1c);
        fVar5 = *(float *)((long)auStack_118 + 0x20);
        fVar6 = *(float *)((long)auStack_118 + 0x24);
        fVar7 = *(float *)((long)auStack_118 + 0x28);
        fVar8 = *(float *)((long)auStack_118 + 0x2c);
        uStack_d8._4_4_ = (float)local_ac;
        uStack_d8._0_4_ = local_b0;
        gtest_ar._0_4_ = local_ac._4_4_;
        local_120 = 0;
        gtest_ar._4_4_ = 0;
        gtest_ar.message_.ptr_._0_4_ = local_a0;
        gtest_ar.message_.ptr_._4_4_ = fStack_9c;
        local_68._0_4_ = local_b0;
        uStack_5c = 0;
        uStack_50 = 0;
        local_68._4_4_ = (float)local_ac;
        local_58 = local_a0;
        fStack_60 = local_ac._4_4_;
        fStack_54 = fStack_9c;
        local_48 = local_90;
        fVar14 = local_ac._4_4_ * fVar5 + (float)local_ac * fVar1 + local_b0 * fVar18;
        fVar15 = local_ac._4_4_ * fVar6 + (float)local_ac * fVar2 + local_b0 * fVar19;
        fVar16 = local_ac._4_4_ * fVar7 + (float)local_ac * fVar3 + local_b0 * fVar20;
        fVar17 = local_ac._4_4_ * fVar8 + (float)local_ac * fVar4 + local_b0 * fVar21;
        fVar22 = fStack_9c * fVar5 + local_a0 * fVar1 + fVar18 * 0.0;
        fVar23 = fStack_9c * fVar6 + local_a0 * fVar2 + fVar19 * 0.0;
        fVar24 = fStack_9c * fVar7 + local_a0 * fVar3 + fVar20 * 0.0;
        fVar25 = fStack_9c * fVar8 + local_a0 * fVar4 + fVar21 * 0.0;
        fVar18 = local_90 * fVar5 + fVar1 * 0.0 + fVar18 * 0.0;
        fVar19 = local_90 * fVar6 + fVar2 * 0.0 + fVar19 * 0.0;
        fVar20 = local_90 * fVar7 + fVar3 * 0.0 + fVar20 * 0.0;
        fVar21 = local_90 * fVar8 + fVar4 * 0.0 + fVar21 * 0.0;
        auStack_118._4_4_ = fVar19 * 0.0 + fVar23 * 0.0 + local_b0 * fVar15;
        auStack_118._0_4_ = fVar18 * 0.0 + fVar22 * 0.0 + local_b0 * fVar14;
        P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[1] =
             fVar21 * 0.0 + fVar25 * 0.0 + local_b0 * fVar17;
        P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[0] =
             fVar20 * 0.0 + fVar24 * 0.0 + local_b0 * fVar16;
        P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[3] =
             fVar19 * 0.0 + local_a0 * fVar23 + (float)local_ac * fVar15;
        P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[2] =
             fVar18 * 0.0 + local_a0 * fVar22 + (float)local_ac * fVar14;
        P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[5] =
             fVar21 * 0.0 + local_a0 * fVar25 + (float)local_ac * fVar17;
        P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[4] =
             fVar20 * 0.0 + local_a0 * fVar24 + (float)local_ac * fVar16;
        P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[6] =
             local_90 * fVar18 + fStack_9c * fVar22 + local_ac._4_4_ * fVar14;
        P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[7] =
             local_90 * fVar19 + fStack_9c * fVar23 + local_ac._4_4_ * fVar15;
        P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[8] =
             local_90 * fVar20 + fStack_9c * fVar24 + local_ac._4_4_ * fVar16;
        P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[9] =
             local_90 * fVar21 + fStack_9c * fVar25 + local_ac._4_4_ * fVar17;
        do {
          lVar13 = 0;
          do {
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)&uStack_d8,"P(i,j)","P_(i,j)",*(float *)((long)local_80 + lVar13)
                       ,*(float *)((long)&this_00->m_xpr + lVar13));
            if (uStack_d8._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_68);
              if ((undefined8 *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_) == (undefined8 *)0x0) {
                pcVar12 = "";
              }
              else {
                pcVar12 = *(char **)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_);
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_38,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/Matrix.cpp"
                         ,0x23,pcVar12);
              testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_68);
              testing::internal::AssertHelper::~AssertHelper(&local_38);
              if (((CONCAT44(local_68._4_4_,(Scalar)local_68) != 0) &&
                  (bVar9 = testing::internal::IsTrue(true), bVar9)) &&
                 ((long *)CONCAT44(local_68._4_4_,(Scalar)local_68) != (long *)0x0)) {
                (**(code **)(*(long *)CONCAT44(local_68._4_4_,(Scalar)local_68) + 8))();
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              return;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            lVar13 = lVar13 + 0x10;
          } while (lVar13 != 0x30);
          local_120 = local_120 + 1;
          local_80 = local_80 + 1;
          this_00 = (CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_> *)
                    ((long)&this_00->m_xpr + 4);
        } while (local_120 != 4);
        return;
      }
      __assert_fail("m_isInitialized && \"LLT is not initialized.\"",
                    "/usr/include/eigen3/Eigen/src/Cholesky/LLT.h",0x89,
                    "typename Traits::MatrixL Eigen::LLT<Eigen::Matrix<float, 3, 3>>::matrixL() const [MatrixType = Eigen::Matrix<float, 3, 3>, UpLo = 1]"
                   );
    }
    pcVar12 = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 4, 3>>::finished() [MatrixType = Eigen::Matrix<float, 4, 3>]"
    ;
  }
  else {
    pcVar12 = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 3, 3>>::finished() [MatrixType = Eigen::Matrix<float, 3, 3>]"
    ;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,pcVar12);
}

Assistant:

TEST(Cholesky, solve) {
    Matrix<T, 4, 3> K;
    Matrix<T, 4, 3> P;
    
    // Set S (lower choleksy factor)
    Matrix<T,3,3> S_;
    S_ << 1, 0, 0, 1, 1, 0, 1, 1, 2;
    
    Cholesky<Matrix<T,3,3>> S;
    S.setL(S_);
    
    // Set P
    P << 6, 4, 2, 4, 8, 6, 2, 6, 0, 3, 5, 7;
    
    // Compute K
    K = S.solve(P.transpose()).transpose();

    Matrix<T, 4, 3> P_ = K * S.matrixL().toDenseMatrix() * S.matrixU().toDenseMatrix();
    
    for(int i = 0; i < 4; i++)
    {
        for(int j = 0; j < 3; j++)
        {
            ASSERT_FLOAT_EQ( P(i,j), P_(i,j) );
        }
    }
}